

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ac3Codec.cpp
# Opt level: O2

AC3ParseError __thiscall AC3Codec::parseHeader(AC3Codec *this,uint8_t *buf,uint8_t *end)

{
  uint8_t *buf_00;
  bool bVar1;
  uint8_t uVar2;
  bool bVar3;
  bool bVar4;
  char cVar5;
  bool bVar6;
  uint8_t uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  int iVar11;
  uint uVar12;
  byte bVar13;
  int iVar14;
  byte bVar15;
  bool bVar16;
  BitStreamReader gbc;
  uint8_t local_50;
  uint8_t local_38;
  char local_34;
  
  if ((*buf != '\v') || (buf[1] != 'w')) {
    return SYNC;
  }
  bVar15 = buf[5];
  if (0x87 < bVar15) {
    return BSID;
  }
  buf_00 = buf + 2;
  this->m_bsid = bVar15 >> 3;
  if (bVar15 < 0x58) {
    bVar15 = buf[4] >> 6;
    this->m_fscod = bVar15;
    if (bVar15 == 3) {
      return SAMPLE_RATE;
    }
    uVar8 = buf[4] & 0x3f;
    this->m_frmsizecod = uVar8;
    if (0x25 < (byte)uVar8) {
      return FRAME_SIZE;
    }
    uVar8 = (uint)ff_ac3_frame_sizes[uVar8][(uint)bVar15] * 2;
    this->m_frame_size = uVar8;
    if (end + 2 < buf_00 + uVar8) {
      return NOT_ENOUGH_BUFFER;
    }
    bVar1 = crc32(buf_00,uVar8 - 4);
    if (bVar1) {
      gbc.super_BitStream.m_totalBits = 0;
      gbc.super_BitStream.m_buffer = (uint *)0x0;
      gbc.super_BitStream.m_initBuffer = (uint *)0x0;
      gbc.m_curVal = 0;
      gbc.m_bitLeft = 0;
      BitStreamReader::setBuffer(&gbc,buf + 5,end);
      this->m_bsidBase = this->m_bsid;
      this->m_strmtyp = '\x02';
      this->m_samples = 0x600;
      BitStreamReader::skipBits(&gbc,5);
      uVar8 = BitStreamReader::getBits(&gbc,3);
      this->m_bsmod = (uint8_t)uVar8;
      uVar8 = BitStreamReader::getBits(&gbc,3);
      this->m_acmod = (uint8_t)uVar8;
      if ((uint8_t)uVar8 != '\x01' && (uVar8 & 1) != 0) {
        BitStreamReader::skipBits(&gbc,2);
        uVar8 = (uint)this->m_acmod;
      }
      uVar2 = (uint8_t)uVar8;
      if ((uVar8 & 4) != 0) {
        BitStreamReader::skipBits(&gbc,2);
        uVar2 = this->m_acmod;
      }
      if (uVar2 == '\x02') {
        uVar8 = BitStreamReader::getBits(&gbc,2);
        this->m_dsurmod = (uint8_t)uVar8;
      }
      uVar8 = BitStreamReader::getBits(&gbc,1);
      this->m_lfeon = (uint8_t)uVar8;
      bVar15 = this->m_bsid - 8;
      if (this->m_bsid < 8) {
        bVar15 = 0;
      }
      this->m_halfratecod = bVar15;
      this->m_sample_rate = (uint)(ff_ac3_freqs[this->m_fscod] >> (bVar15 & 0x1f));
      this->m_bit_rate = (uint)ff_ac3_bitratetab[this->m_frmsizecod >> 1] * 1000 >> (bVar15 & 0x1f);
      this->m_channels = (uint8_t)uVar8 + "\x02\x01\x02\x03\x03\x04\x04\x05"[this->m_acmod];
      return NO_ERROR;
    }
    return CRC2;
  }
  iVar11 = (buf[2] & 7) * 0x200;
  uVar8 = iVar11 + (uint)buf[3] * 2;
  uVar12 = iVar11 + (uint)buf[3] * 2 + 2;
  this->m_frame_size = uVar12;
  if (uVar8 < 5) {
    return FRAME_SIZE;
  }
  if (end + 2 < buf_00 + uVar12) {
    return NOT_ENOUGH_BUFFER;
  }
  bVar1 = crc32(buf_00,uVar8 - 2);
  if (!bVar1) {
    return CRC2;
  }
  gbc.super_BitStream.m_totalBits = 0;
  gbc.super_BitStream.m_buffer = (uint *)0x0;
  gbc.super_BitStream.m_initBuffer = (uint *)0x0;
  gbc.m_curVal = 0;
  gbc.m_bitLeft = 0;
  BitStreamReader::setBuffer(&gbc,buf_00,end);
  uVar8 = BitStreamReader::getBits(&gbc,2);
  this->m_strmtyp = (uint8_t)uVar8;
  if ((uint8_t)uVar8 == '\x03') {
    return SYNC;
  }
  BitStreamReader::skipBits(&gbc,0xe);
  uVar8 = BitStreamReader::getBits(&gbc,2);
  uVar12 = BitStreamReader::getBits(&gbc,2);
  iVar11 = 6;
  bVar15 = (byte)uVar8;
  if (bVar15 == 3) {
    if ((int)((ulong)uVar12 & 0xff) == 3) {
      return SYNC;
    }
    this->m_sample_rate = (uint)(ff_ac3_freqs[(ulong)uVar12 & 0xff] >> 1);
    uVar12 = 3;
LAB_0018c3fc:
    bVar1 = false;
  }
  else {
    this->m_sample_rate = (uint)ff_ac3_freqs[uVar8 & 0xff];
    if ((char)uVar12 == '\0') {
      iVar11 = 1;
      bVar1 = true;
    }
    else {
      if ((uVar12 & 0xff) != 1) {
        if ((uVar12 & 0xff) == 2) {
          iVar11 = 3;
        }
        goto LAB_0018c3fc;
      }
      bVar1 = false;
      iVar11 = 2;
    }
  }
  uVar8 = BitStreamReader::getBits(&gbc,3);
  uVar9 = BitStreamReader::getBits(&gbc,1);
  bVar13 = "\x01\x02\x03\x06"[uVar12 & 0xff];
  this->m_samples = (uint)bVar13 << 8;
  this->m_bit_rateExt = (this->m_frame_size * this->m_sample_rate * 8) / (int)((uint)bVar13 << 8);
  BitStreamReader::skipBits(&gbc,5);
  bVar13 = (byte)uVar8;
  iVar14 = (bVar13 == 0) + 1;
  while (bVar16 = iVar14 != 0, iVar14 = iVar14 + -1, bVar16) {
    BitStreamReader::skipBits(&gbc,5);
    bVar16 = BitStreamReader::getBit(&gbc);
    if (bVar16) {
      BitStreamReader::skipBits(&gbc,8);
    }
  }
  if (((this->m_strmtyp == '\x01') && (bVar16 = BitStreamReader::getBit(&gbc), bVar16)) &&
     (uVar10 = BitStreamReader::getBits(&gbc,0x10), (uVar10 & 0x7fe0) != 0)) {
    this->m_extChannelsExists = true;
  }
  bVar16 = BitStreamReader::getBit(&gbc);
  bVar3 = false;
  bVar6 = false;
  bVar4 = false;
  cVar5 = '\0';
  local_38 = (uint8_t)uVar9;
  if (bVar16) {
    if ((2 < bVar13) && (BitStreamReader::skipBits(&gbc,2), (uVar8 & 1) != 0)) {
      BitStreamReader::skipBits(&gbc,6);
    }
    if ((uVar8 & 4) != 0) {
      BitStreamReader::skipBits(&gbc,6);
    }
    if ((local_38 != '\0') && (bVar16 = BitStreamReader::getBit(&gbc), bVar16)) {
      BitStreamReader::skipBits(&gbc,5);
    }
    bVar3 = false;
    bVar6 = false;
    bVar4 = false;
    cVar5 = '\0';
    if (this->m_strmtyp == '\0') {
      bVar3 = BitStreamReader::getBit(&gbc);
      if (bVar3) {
        BitStreamReader::skipBits(&gbc,6);
      }
      if ((bVar13 == 0) && (bVar16 = BitStreamReader::getBit(&gbc), bVar16)) {
        BitStreamReader::skipBits(&gbc,6);
      }
      bVar4 = BitStreamReader::getBit(&gbc);
      if (bVar4) {
        BitStreamReader::skipBits(&gbc,6);
      }
      uVar9 = BitStreamReader::getBits(&gbc,2);
      cVar5 = (char)uVar9;
      if (cVar5 == '\x03') {
        uVar9 = BitStreamReader::getBits(&gbc,5);
        bVar16 = BitStreamReader::getBit(&gbc);
        if (bVar16) {
          BitStreamReader::skipBits(&gbc,5);
          bVar16 = BitStreamReader::getBit(&gbc);
          if (bVar16) {
            BitStreamReader::skipBits(&gbc,4);
          }
          bVar16 = BitStreamReader::getBit(&gbc);
          if (bVar16) {
            BitStreamReader::skipBits(&gbc,4);
          }
          bVar16 = BitStreamReader::getBit(&gbc);
          if (bVar16) {
            BitStreamReader::skipBits(&gbc,4);
          }
          bVar16 = BitStreamReader::getBit(&gbc);
          if (bVar16) {
            BitStreamReader::skipBits(&gbc,4);
          }
          bVar16 = BitStreamReader::getBit(&gbc);
          if (bVar16) {
            BitStreamReader::skipBits(&gbc,4);
          }
          bVar16 = BitStreamReader::getBit(&gbc);
          if (bVar16) {
            BitStreamReader::skipBits(&gbc,4);
          }
          bVar16 = BitStreamReader::getBit(&gbc);
          if (bVar16) {
            BitStreamReader::skipBits(&gbc,4);
          }
          bVar16 = BitStreamReader::getBit(&gbc);
          if (bVar16) {
            bVar16 = BitStreamReader::getBit(&gbc);
            if (bVar16) {
              BitStreamReader::skipBits(&gbc,4);
            }
            bVar16 = BitStreamReader::getBit(&gbc);
            if (bVar16) {
              BitStreamReader::skipBits(&gbc,4);
            }
          }
        }
        bVar16 = BitStreamReader::getBit(&gbc);
        if (bVar16) {
          BitStreamReader::skipBits(&gbc,5);
          bVar16 = BitStreamReader::getBit(&gbc);
          if (bVar16) {
            BitStreamReader::skipBits(&gbc,7);
            bVar16 = BitStreamReader::getBit(&gbc);
            if (bVar16) {
              BitStreamReader::skipBits(&gbc,7);
            }
          }
        }
        iVar14 = (uVar9 & 0xff) + 2;
        while (bVar16 = iVar14 != 0, iVar14 = iVar14 + -1, bVar16) {
          BitStreamReader::skipBits(&gbc,8);
        }
        BitStreamReader::alignByte(&gbc);
      }
      else {
        if ((uVar9 & 0xff) == 2) {
          uVar9 = 0xc;
        }
        else {
          if ((uVar9 & 0xff) != 1) goto LAB_0018c7e1;
          uVar9 = 5;
        }
        BitStreamReader::skipBits(&gbc,uVar9);
      }
LAB_0018c7e1:
      if (bVar13 < 2) {
        bVar6 = BitStreamReader::getBit(&gbc);
        if (bVar6) {
          BitStreamReader::skipBits(&gbc,0xe);
        }
        if ((bVar13 == 0) && (bVar16 = BitStreamReader::getBit(&gbc), bVar16)) {
          BitStreamReader::skipBits(&gbc,0xe);
        }
      }
      else {
        bVar6 = false;
      }
      bVar16 = BitStreamReader::getBit(&gbc);
      if (bVar16) {
        if (bVar1) {
          BitStreamReader::skipBits(&gbc,5);
        }
        else {
          while (bVar1 = iVar11 != 0, iVar11 = iVar11 + -1, bVar1) {
            bVar1 = BitStreamReader::getBit(&gbc);
            if (bVar1) {
              BitStreamReader::skipBits(&gbc,5);
            }
          }
        }
      }
    }
  }
  bVar1 = BitStreamReader::getBit(&gbc);
  if (!bVar1) {
    uVar2 = '\0';
    local_50 = '\0';
    goto LAB_0018c949;
  }
  uVar9 = BitStreamReader::getBits(&gbc,3);
  local_50 = (uint8_t)uVar9;
  BitStreamReader::skipBits(&gbc,2);
  if (bVar13 == 2) {
    uVar9 = BitStreamReader::getBits(&gbc,2);
    uVar7 = (uint8_t)uVar9;
LAB_0018c8f0:
    uVar2 = uVar7;
    BitStreamReader::skipBits(&gbc,2);
  }
  else {
    uVar2 = '\0';
    uVar7 = '\0';
    if (5 < bVar13) goto LAB_0018c8f0;
  }
  bVar1 = BitStreamReader::getBit(&gbc);
  if (bVar1) {
    BitStreamReader::skipBits(&gbc,8);
  }
  if ((bVar13 == 0) && (bVar1 = BitStreamReader::getBit(&gbc), bVar1)) {
    BitStreamReader::skipBits(&gbc,8);
  }
  if (bVar15 < 3) {
    BitStreamReader::skipBit(&gbc);
  }
LAB_0018c949:
  uVar7 = this->m_strmtyp;
  local_34 = (char)uVar12;
  if (local_34 != '\x03' && uVar7 == '\0') {
    BitStreamReader::skipBit(&gbc);
    uVar7 = this->m_strmtyp;
  }
  if ((uVar7 == '\x02') && ((local_34 == '\x03' || (bVar1 = BitStreamReader::getBit(&gbc), bVar1))))
  {
    BitStreamReader::skipBits(&gbc,6);
  }
  bVar1 = BitStreamReader::getBit(&gbc);
  if ((((bVar1) && (uVar12 = BitStreamReader::getBits(&gbc,6), uVar12 == 1)) &&
      (uVar12 = BitStreamReader::getBits(&gbc,8), uVar12 == 1)) &&
     (uVar12 = BitStreamReader::getBits(&gbc,8), uVar12 < 0x11)) {
    this->m_isAtmos = true;
  }
  this->m_mixinfoexists = (bool)(bVar6 | bVar3 | bVar4 | cVar5 != '\0');
  if (this->m_channels == '\0') {
    this->m_acmod = bVar13;
    this->m_lfeon = local_38;
    this->m_bsmod = local_50;
    this->m_fscod = bVar15;
    this->m_dsurmod = uVar2;
    this->m_channels = local_38 + "\x02\x01\x02\x03\x03\x04\x04\x05"[uVar8 & 0xff];
  }
  return NO_ERROR;
}

Assistant:

AC3Codec::AC3ParseError AC3Codec::parseHeader(uint8_t *buf, const uint8_t *end)
{
    if (*buf++ != 0x0B || *buf++ != 0x77)
        return AC3ParseError::SYNC;

    // read ahead to bsid to make sure this is AC-3, not E-AC-3
    const uint8_t id = buf[3] >> 3;
    if (id > 16)
        return AC3ParseError::BSID;

    m_bsid = id;

    // ---------------------------------- EAC3 ------------------------------------------
    if (m_bsid > 10)
    {
        m_frame_size = static_cast<uint16_t>((((buf[0] & 0x07) << 8 | buf[1]) + 1) << 1);
        if (m_frame_size < AC3_HEADER_SIZE)
            return AC3ParseError::FRAME_SIZE;  // invalid header size

        if (end + 2 < m_frame_size + buf)
            return AC3ParseError::NOT_ENOUGH_BUFFER;

        if (!crc32(buf, m_frame_size - 4))
            return AC3ParseError::CRC2;

        uint8_t bsmod = 0, dsurmod = 0, numblkscod, mixdef = 0;
        int extpgmscle, paninfoe;
        int pgmscle = extpgmscle = paninfoe = 0;

        BitStreamReader gbc{};
        gbc.setBuffer(buf, end);

        m_strmtyp = gbc.getBits<uint8_t>(2);
        if (m_strmtyp == 3)
            return AC3ParseError::SYNC;  // invalid stream type

        gbc.skipBits(14);  // substreamid, frmsize

        const auto fscod = gbc.getBits<uint8_t>(2);

        if (fscod == 3)
        {
            const auto m_fscod2 = gbc.getBits<uint8_t>(2);
            if (m_fscod2 == 3)
                return AC3ParseError::SYNC;

            numblkscod = 3;
            m_sample_rate = ff_ac3_freqs[m_fscod2] / 2;
        }
        else
        {
            numblkscod = gbc.getBits<uint8_t>(2);
            m_sample_rate = ff_ac3_freqs[fscod];
        }
        const int number_of_blocks_per_syncframe =
            numblkscod == 0 ? 1 : (numblkscod == 1 ? 2 : (numblkscod == 2 ? 3 : 6));
        const auto acmod = gbc.getBits<uint8_t>(3);
        const auto lfeon = gbc.getBits<uint8_t>(1);

        m_samples = eac3_blocks[numblkscod] << 8;
        m_bit_rateExt = m_frame_size * m_sample_rate * 8 / m_samples;

        gbc.skipBits(5);  // skip bsid, already got it
        for (int i = 0; i < (acmod ? 1 : 2); i++)
        {
            gbc.skipBits(5);  // skip dialog normalization
            if (gbc.getBit())
                gbc.skipBits(8);  // skip Compression gain word
        }

        if (m_strmtyp == 1)  // dependent EAC3 frame
        {
            if (gbc.getBit())
            {
                const auto chanmap = gbc.getBits<int16_t>(16);
                if (chanmap & 0x7fe0)  // mask standard 5.1 channels
                    m_extChannelsExists = true;
            }
        }

        if (gbc.getBit())  // mixing metadata
        {
            if (acmod > 2)
                gbc.skipBits(2);  // dmixmod
            if (acmod & 1 && acmod > 0x2)
                gbc.skipBits(6);  // ltrtcmixlev, lorocmixlev
            if (acmod & 4)
                gbc.skipBits(6);  // ltrtsurmixlev, lorosurmixlev
            if (lfeon && gbc.getBit())
                gbc.skipBits(5);  // lfemixlevcod
            if (m_strmtyp == 0)   // independent EAC3 frame
            {
                pgmscle = gbc.getBit();
                if (pgmscle)
                    gbc.skipBits(6);  // pgmscl
                if (acmod == 0 && gbc.getBit())
                    gbc.skipBits(6);  // pgmscl2
                extpgmscle = gbc.getBit();
                if (extpgmscle)
                    gbc.skipBits(6);  // extpgmscl
                mixdef = gbc.getBits<uint8_t>(2);
                if (mixdef == 1)
                    gbc.skipBits(5);  // premixcmpsel, drcsrc, premixcmpscl
                else if (mixdef == 2)
                    gbc.skipBits(12);  // mixdata
                else if (mixdef == 3)
                {
                    const auto mixdeflen = gbc.getBits<uint8_t>(5);
                    if (gbc.getBit())  // mixdata2e
                    {
                        gbc.skipBits(5);  // premixcmpsel, drcsrc, premixcmpscl
                        if (gbc.getBit())
                            gbc.skipBits(4);  // extpgmlscl
                        if (gbc.getBit())
                            gbc.skipBits(4);  // extpgmcscl
                        if (gbc.getBit())
                            gbc.skipBits(4);  // extpgmrscl
                        if (gbc.getBit())
                            gbc.skipBits(4);  // extpgmlscl
                        if (gbc.getBit())
                            gbc.skipBits(4);  // extpgmrsscl
                        if (gbc.getBit())
                            gbc.skipBits(4);  // extpgmlfescl
                        if (gbc.getBit())
                            gbc.skipBits(4);  // dmixscl
                        if (gbc.getBit())     // addch exist
                        {
                            if (gbc.getBit())     // extpgmaux1scl exist
                                gbc.skipBits(4);  // extpgmaux1scl
                            if (gbc.getBit())     // extpgmaux2scl exist
                                gbc.skipBits(4);  // extpgmaux2scl
                        }
                    }
                    if (gbc.getBit())  // mixdata3e
                    {
                        gbc.skipBits(5);   // spchdat
                        if (gbc.getBit())  // addspchdat exist
                        {
                            gbc.skipBits(7);      // spchdat1, spchan1att
                            if (gbc.getBit())     // addspchdat2 exist
                                gbc.skipBits(7);  // spchdat2, spchan2att
                        }
                    }
                    for (int i = 0; i < mixdeflen + 2; i++) gbc.skipBits(8);  // mixdata
                    gbc.alignByte();                                          // mixdatafill
                }
                if (acmod < 2)
                {
                    paninfoe = gbc.getBit();
                    if (paninfoe)
                        gbc.skipBits(14);  // panmean, paninfo
                    if (acmod == 0 && gbc.getBit())
                        gbc.skipBits(14);  // panmean2, paninfo2
                }
                if (gbc.getBit())
                {
                    if (numblkscod == 0)
                        gbc.skipBits(5);  // blkmixcfginfo[0]
                    else
                        for (int blk = 0; blk < number_of_blocks_per_syncframe; blk++)
                            if (gbc.getBit())
                                gbc.skipBits(5);  // blkmixcfginfo[blk]
                }
            }
        }

        if (gbc.getBit()) /* informational metadata */
        {
            bsmod = gbc.getBits<uint8_t>(3);
            gbc.skipBits(2);  // copyrightb, origbs
            if (acmod == 2)
            {
                dsurmod = gbc.getBits<uint8_t>(2);
                gbc.skipBits(2);  // dheadphonmod
            }
            else if (acmod >= 6)  /* if both surround channels exist */
                gbc.skipBits(2);  // dsurexmod
            if (gbc.getBit())     // audprodie
                gbc.skipBits(8);  // mixlevel, roomtype, adconvtyp
            if (acmod == 0)       /* if 1+1 mode (dual mono, so some items need a second value) */
            {
                if (gbc.getBit())     // audprodi2e
                    gbc.skipBits(8);  // mixlevel2, roomtype2, adconvtyp2
            }
            if (fscod < 3)      /* if not half sample rate */
                gbc.skipBit();  // sourcefscod
        }

        if (m_strmtyp == 0 && numblkscod != 3)
            gbc.skipBit();  // convsync

        if (m_strmtyp == 2) /* if bit stream converted from AC-3 */
        {
            if (numblkscod == 3 || gbc.getBit())  // blkid
                gbc.skipBits(6);                  // frmsizecod
        }

        if (gbc.getBit())  // addbsi exist
        {
            if (gbc.getBits(6) == 1)  // addbsi length
            {
                // ETSI TS 103 420 - Backwards-compatible object audio carriage using Enhanced AC-3
                // para. 8.3 Extensions contained in the addbsi bitstream field
                // TODO: conditions below might not be sufficient to detect Atmos
                // ideally, detect payload syncword (but where is it located ?)
                const auto flag_ec3_extension_type_a = gbc.getBits(8) == 1;
                if (flag_ec3_extension_type_a)
                {
                    const auto complexity_index_type_a = gbc.getBits(8);
                    if (complexity_index_type_a <= 16)
                        m_isAtmos = true;
                }
            }
        }

        m_mixinfoexists = pgmscle || extpgmscle || mixdef > 0 || paninfoe;

        if (m_channels == 0)  // no AC3 interleave
        {
            m_acmod = acmod;
            m_lfeon = lfeon;
            m_bsmod = bsmod;
            m_fscod = fscod;
            m_dsurmod = dsurmod;
            m_channels = static_cast<uint8_t>(ff_ac3_channels[acmod] + lfeon);
        }
    }
    // ---------------------------------- AC3 ------------------------------------------
    else
    {
        m_fscod = buf[2] >> 6;
        if (m_fscod == 3)
            return AC3ParseError::SAMPLE_RATE;

        m_frmsizecod = buf[2] & 0x3f;
        if (m_frmsizecod > 37)
            return AC3ParseError::FRAME_SIZE;

        m_frame_size = ff_ac3_frame_sizes[m_frmsizecod][m_fscod] << 1;
        if (end + 2 < m_frame_size + buf)
            return AC3ParseError::NOT_ENOUGH_BUFFER;

        if (!crc32(buf, m_frame_size - 4))
            return AC3ParseError::CRC2;

        BitStreamReader gbc{};
        gbc.setBuffer(buf + 3, end);

        m_bsidBase = m_bsid;  // id except AC3+ frames
        m_strmtyp = 2;
        m_samples = AC3_FRAME_SIZE;

        gbc.skipBits(5);  // skip bsid, already got it
        m_bsmod = gbc.getBits<uint8_t>(3);
        m_acmod = gbc.getBits<uint8_t>(3);
        if ((m_acmod & 1) && m_acmod != AC3_ACMOD_MONO)  // 3 front channels
            gbc.skipBits(2);                             // m_cmixlev
        if (m_acmod & 4)                                 // surround channel exists
            gbc.skipBits(2);                             // m_surmixlev
        if (m_acmod == AC3_ACMOD_STEREO)
            m_dsurmod = gbc.getBits<uint8_t>(2);
        m_lfeon = gbc.getBits<uint8_t>(1);

        m_halfratecod = max(m_bsid, 8) - 8;
        m_sample_rate = ff_ac3_freqs[m_fscod] >> m_halfratecod;
        m_bit_rate = (ff_ac3_bitratetab[m_frmsizecod >> 1] * 1000) >> m_halfratecod;
        m_channels = static_cast<uint8_t>(ff_ac3_channels[m_acmod] + m_lfeon);
    }
    return AC3ParseError::NO_ERROR;
}